

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void * __thiscall
anon_unknown.dwarf_6027d3::BumpPointerAllocator::allocate(BumpPointerAllocator *this,size_t N)

{
  BlockMeta *pBVar1;
  size_t sVar2;
  BlockMeta *pBVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = (int)N + 0xfU & 0xfffffff0;
  uVar5 = (ulong)uVar4;
  pBVar1 = this->BlockList;
  if (0xfef < pBVar1->Current + uVar5) {
    if (0xff0 < uVar4) {
      pBVar3 = (BlockMeta *)malloc(uVar5 + 0x10);
      if (pBVar3 == (BlockMeta *)0x0) {
LAB_001ec035:
        std::terminate();
      }
      pBVar3->Next = pBVar1->Next;
      pBVar3->Current = 0;
      pBVar1->Next = pBVar3;
      goto LAB_001ec02f;
    }
    pBVar3 = (BlockMeta *)malloc(0x1000);
    if (pBVar3 == (BlockMeta *)0x0) goto LAB_001ec035;
    pBVar3->Next = pBVar1;
    pBVar3->Current = 0;
    this->BlockList = pBVar3;
  }
  pBVar1 = this->BlockList;
  sVar2 = pBVar1->Current;
  pBVar1->Current = uVar5 + sVar2;
  pBVar3 = (BlockMeta *)((long)&pBVar1->Next + sVar2);
LAB_001ec02f:
  return pBVar3 + 1;
}

Assistant:

void* allocate(size_t N) {
    N = (N + 15u) & ~15u;
    if (N + BlockList->Current >= UsableAllocSize) {
      if (N > UsableAllocSize)
        return allocateMassive(N);
      grow();
    }
    BlockList->Current += N;
    return static_cast<void*>(reinterpret_cast<char*>(BlockList + 1) +
                              BlockList->Current - N);
  }